

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

TRef recff_string_start(jit_State *J,GCstr *s,int32_t *st,TRef tr,TRef trlen,TRef tr0)

{
  TRef TVar1;
  int32_t iVar2;
  int iVar3;
  IRRef1 IVar4;
  IRRef1 IVar5;
  
  iVar3 = *st;
  IVar5 = (IRRef1)tr;
  IVar4 = (IRRef1)tr0;
  if (iVar3 < 0) {
    (J->fold).ins.field_0.ot = 0x93;
    (J->fold).ins.field_0.op1 = IVar5;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = (IRRef1)trlen;
    (J->fold).ins.field_0.op2 = IVar5;
    TVar1 = lj_opt_fold(J);
    iVar3 = iVar3 + s->len;
    if (-1 < iVar3) {
      tr0 = TVar1;
    }
    iVar2 = 0;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    (J->fold).ins.field_0.ot = (ushort)(-1 < iVar3) << 8 | 0x93;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
  }
  else if (iVar3 == 0) {
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = IVar5;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    iVar2 = 0;
  }
  else {
    TVar1 = lj_ir_kint(J,-1);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = IVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    tr0 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x193;
    (J->fold).ins.field_0.op1 = (IRRef1)tr0;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    iVar2 = iVar3 + -1;
  }
  *st = iVar2;
  return tr0;
}

Assistant:

static TRef recff_string_start(jit_State *J, GCstr *s, int32_t *st, TRef tr,
			       TRef trlen, TRef tr0)
{
  int32_t start = *st;
  if (start < 0) {
    emitir(IRTGI(IR_LT), tr, tr0);
    tr = emitir(IRTI(IR_ADD), trlen, tr);
    start = start + (int32_t)s->len;
    emitir(start < 0 ? IRTGI(IR_LT) : IRTGI(IR_GE), tr, tr0);
    if (start < 0) {
      tr = tr0;
      start = 0;
    }
  } else if (start == 0) {
    emitir(IRTGI(IR_EQ), tr, tr0);
    tr = tr0;
  } else {
    tr = emitir(IRTI(IR_ADD), tr, lj_ir_kint(J, -1));
    emitir(IRTGI(IR_GE), tr, tr0);
    start--;
  }
  *st = start;
  return tr;
}